

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O1

void __thiscall
ktx::CommandExtract::saveEXR
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,
          vector<int,_std::allocator<int>_> *pixelTypes,char *data,size_t size)

{
  pointer puVar1;
  pointer piVar2;
  CommandExtract *pCVar3;
  _EXRAttribute *p_Var4;
  iterator iVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  char *__s;
  EXRChannelInfo *__dest;
  int *piVar9;
  EXRAttribute *pEVar10;
  void *pvVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  VkFormat extraout_EDX;
  VkFormat format_00;
  uchar **ppuVar15;
  size_t sVar16;
  uint uVar17;
  uint uVar18;
  Reporter *report;
  long lVar19;
  undefined4 in_register_0000008c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar20;
  uint uVar21;
  long lVar22;
  float fVar23;
  string_view fmt;
  format_args args;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  images;
  EXRStruct exr;
  array<unsigned_int_*,_4UL> imagePtrs;
  OutputStream file;
  Primaries primaries;
  uint local_3e8;
  uint32_t local_3d4;
  void *local_3c8;
  undefined8 uStack_3c0;
  long local_3b8;
  ulong local_3a8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_3a0;
  string *local_388;
  CommandExtract *local_380;
  FormatDescriptor *local_378;
  ulong local_370;
  ulong local_368;
  ulong local_360;
  undefined1 local_358 [168];
  _EXRAttribute *local_2b0;
  iterator iStack_2a8;
  _EXRAttribute *local_2a0;
  char *pcStack_298;
  uchar *local_290;
  undefined8 local_288;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  undefined4 local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined1 local_260 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250 [15];
  char local_160 [256];
  uchar *local_60;
  int local_58;
  uchar local_50 [32];
  VkFormat extraout_EDX_00;
  
  aVar20._4_4_ = in_register_0000008c;
  aVar20._0_4_ = width;
  if ((format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("!format.samples.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x367,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  if ((appendExtension) && (iVar7 = std::__cxx11::string::compare((char *)filepath), iVar7 != 0)) {
    std::__cxx11::string::append((char *)filepath);
  }
  local_3c8 = (void *)0x0;
  uStack_3c0 = 0;
  local_3b8 = 0;
  uVar14 = *(ulong *)&format->basic;
  if (((uint)uVar14 & 0xff) == 1) {
    local_260._8_8_ = &local_3c8;
    local_260._0_8_ = format;
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(local_260,KHR_DF_CHANNEL_BC2_ALPHA,"A");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(local_260,KHR_DF_CHANNEL_COMMON_D,"D");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(local_260,KHR_DF_CHANNEL_COMMON_S,"S");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(local_260,KHR_DF_CHANNEL_CIEXYY_YLUMA,"B");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(local_260,KHR_DF_CHANNEL_BC1A_ALPHA,"G");
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()(local_260,KHR_DF_CHANNEL_ASTC_DATA,"R");
  }
  else {
    __s = (char *)dfdToStringColorModel();
    if (__s == (char *)0x0) {
      local_358._0_8_ = uVar14 & 0xff;
      fmt.size_ = 2;
      fmt.data_ = (char *)0xa;
      args.field_1.args_ = aVar20.args_;
      args.desc_ = (unsigned_long_long)local_358;
      ::fmt::v10::vformat_abi_cxx11_((string *)local_260,(v10 *)"(0x{:02X})",fmt,args);
      format_00 = extraout_EDX_00;
    }
    else {
      local_260._0_8_ = local_250;
      sVar16 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_260,__s,__s + sVar16);
      format_00 = extraout_EDX;
    }
    toString_abi_cxx11_((string *)local_358,(ktx *)(ulong)vkFormat,format_00);
    Reporter::fatal<char_const(&)[42],std::__cxx11::string,std::__cxx11::string>
              (&(this->super_Command).super_Reporter,NOT_SUPPORTED,
               (char (*) [42])"EXR saving is unsupported for {} with {}.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
               (string *)local_358);
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_358._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._0_8_ != local_250) {
      operator_delete((void *)local_260._0_8_,local_250[0]._M_allocated_capacity + 1);
    }
  }
  uVar13 = (uint)(byte)(format->basic).field_0x8;
  local_3e8 = 3;
  if (vkFormat != VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
    local_3e8 = (format->extended).channelCount;
  }
  if (uVar13 * height * width != size) {
    __assert_fail("size == width * height * pixelBytes",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x392,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  local_3a8 = (ulong)local_3e8;
  if ((long)(pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 != local_3a8) {
    __assert_fail("numChannels == pixelTypes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x393,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  local_378 = format;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_3a0,local_3a8,(allocator_type *)local_260);
  local_278 = 0;
  uStack_274 = 0;
  uStack_270 = 0;
  uStack_26c = 0;
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  uStack_280 = 0;
  uStack_27c = 0;
  if (local_3e8 != 0) {
    lVar19 = local_3a8 * 0x18;
    lVar22 = 0;
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&((local_3a0.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar22),(ulong)(height * width));
      lVar22 = lVar22 + 0x18;
    } while (lVar19 != lVar22);
  }
  local_388 = filepath;
  local_380 = this;
  if (height != 0) {
    local_370 = (ulong)width;
    local_3d4 = 0;
    do {
      if (width != 0) {
        local_368 = (ulong)(local_3d4 * width);
        uVar14 = 0;
        do {
          uVar17 = (int)local_368 + (int)uVar14;
          local_360 = uVar14;
          if (vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
            if (local_3e8 != 3) {
              __assert_fail("numChannels == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                            ,0x3a2,
                            "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                           );
            }
            if (*(pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start != 1) {
              __assert_fail("pixelTypes[0] == TINYEXR_PIXELTYPE_HALF",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                            ,0x3a3,
                            "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                           );
            }
            uVar21 = *(uint *)(data + uVar17 * uVar13);
            fVar23 = ldexpf(1.0,(uVar21 >> 0x1b) - 0x18);
            local_3a0.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] = (uint)((float)(uVar21 & 0x1ff) * fVar23);
            local_3a0.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar17] = (uint)((float)(uVar21 >> 9 & 0x1ff) * fVar23)
            ;
            ((local_3a0.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar17] =
                 (uint)((float)(uVar21 >> 0x12 & 0x1ff) * fVar23);
          }
          else if (local_3e8 != 0) {
            piVar2 = (pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar14 = 0;
            do {
              uVar21 = *(uint *)((long)local_3c8 + uVar14 * 0x18 + 4);
              if (0x20 < uVar21) {
                __assert_fail("numBits <= sizeof(T) * 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0x8d,
                              "T imageio::extract_bits(const void *, uint32_t, uint32_t) [T = unsigned int]"
                             );
              }
              iVar7 = *(int *)((long)local_3c8 + uVar14 * 0x18);
              local_260._0_8_ = local_260._0_8_ & 0xffffffff00000000;
              if (uVar21 != 0) {
                uVar18 = 0;
                do {
                  uVar8 = iVar7 + uVar18;
                  bVar12 = (byte)(1 << ((byte)uVar18 & 7));
                  if ((*(byte *)((long)(data + uVar17 * uVar13) + (ulong)(uVar8 >> 3)) >>
                       (uVar8 & 7) & 1) == 0) {
                    bVar12 = 0;
                  }
                  local_260[uVar18 >> 3] = local_260[uVar18 >> 3] | bVar12;
                  uVar18 = uVar18 + 1;
                } while (uVar21 != uVar18);
              }
              puVar1 = local_3a0.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar14].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar7 = piVar2[uVar14];
              fVar23 = (float)local_260._0_4_;
              if (iVar7 - 1U < 2) {
                if (*(char *)((long)local_3c8 + uVar14 * 0x18 + 0x10) == '\x01') {
                  if (*(char *)((long)local_3c8 + uVar14 * 0x18 + 0x11) == '\x01') {
                    if (uVar21 == 0x10) {
                      uVar21 = local_260._0_4_ << 0xd;
                      if ((uVar21 & 0xf800000) == 0xf800000) {
                        fVar23 = (float)(uVar21 & 0x1fffe000 | 0x70000000);
                      }
                      else if ((uVar21 & 0xf800000) == 0) {
                        fVar23 = (float)(uVar21 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
                      }
                      else {
                        fVar23 = (float)((uVar21 & 0xfffe000) + 0x38000000);
                      }
                      fVar23 = (float)((local_260._0_4_ & 0x8000) << 0x10 | (uint)fVar23);
                    }
                    else if (uVar21 != 0x20) {
                      __assert_fail("numBits == 16 || numBits == 32",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                    ,0xad,"float imageio::convertSFloatToFloat(uint32_t, uint32_t)")
                      ;
                    }
LAB_001920b4:
                    puVar1[uVar17] = (uint)fVar23;
                  }
                  else {
                    if ((uVar21 & 0x3e) != 10) {
                      __assert_fail("numBits == 10 || numBits == 11",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                    ,0xb5,"float imageio::convertUFloatToFloat(uint32_t, uint32_t)")
                      ;
                    }
                    if (uVar21 == 0xb) {
                      if ((float)local_260._0_4_ != 0.0) {
                        if (((float)local_260._0_4_ == 2.78018e-42) ||
                           ((float)local_260._0_4_ == 2.86846e-42)) goto LAB_0019203c;
                        iVar7 = (local_260._0_4_ & 0x7ff) << 0x11;
LAB_001920c8:
                        fVar23 = (float)(iVar7 + 0x38000000);
                      }
                    }
                    else {
                      fVar23 = 0.0;
                      if ((uVar21 == 10) &&
                         (fVar23 = (float)local_260._0_4_, (float)local_260._0_4_ != 0.0)) {
                        if (((float)local_260._0_4_ != 1.39009e-42) &&
                           ((float)local_260._0_4_ != 1.43353e-42)) {
                          iVar7 = (local_260._0_4_ & 0x3ff) << 0x12;
                          goto LAB_001920c8;
                        }
LAB_0019203c:
                        fVar23 = -1.0;
                      }
                    }
                    puVar1[uVar17] = (uint)fVar23;
                  }
                }
                else {
                  cVar6 = *(char *)((long)local_3c8 + uVar14 * 0x18 + 0x11);
                  uVar18 = uVar21 - 1;
                  if (*(char *)((long)local_3c8 + uVar14 * 0x18 + 0x12) == '\x01') {
                    if (cVar6 == '\0') {
                      if (0x1f < uVar18) {
                        __assert_fail("numBits > 0 && numBits <= 32",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                      ,0xcd,"float imageio::convertUNORMToFloat(uint32_t, uint32_t)"
                                     );
                      }
                      bVar12 = (byte)uVar21;
                    }
                    else {
                      if (0x1f < uVar18) {
                        __assert_fail("numBits > 0 && numBits <= 32",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                      ,200,"float imageio::convertSNORMToFloat(uint32_t, uint32_t)")
                        ;
                      }
                      bVar12 = (byte)uVar18;
                    }
                    puVar1[uVar17] =
                         (uint)((float)(local_260._0_8_ & 0xffffffff) /
                               (float)~(-1 << (bVar12 & 0x1f)));
                  }
                  else {
                    if (cVar6 == '\0') {
                      if (0x1f < uVar18) {
                        __assert_fail("numBits > 0 && numBits <= 32",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                      ,0xc4,"float imageio::convertUIntToFloat(uint32_t, uint32_t)")
                        ;
                      }
                      fVar23 = (float)(local_260._0_8_ & 0xffffffff);
                    }
                    else {
                      if (0x1f < uVar18) {
                        __assert_fail("numBits > 0 && numBits <= 32",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                      ,0xbd,"float imageio::convertSIntToFloat(uint32_t, uint32_t)")
                        ;
                      }
                      uVar8 = local_260._0_4_ & ~(1 << (uVar18 & 0x1f));
                      uVar21 = -uVar8;
                      if (((uint)local_260._0_4_ >> (uVar18 & 0x1f) & 1) == 0) {
                        uVar21 = uVar8;
                      }
                      fVar23 = (float)(int)uVar21;
                    }
                    puVar1[uVar17] = (uint)fVar23;
                  }
                }
              }
              else {
                if (iVar7 != 0) {
                  __assert_fail("false && \"Internal error\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                                ,0x3d1,
                                "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                               );
                }
                cVar6 = *(char *)((long)local_3c8 + uVar14 * 0x18 + 0x10);
                if (cVar6 == '\x01') {
                  if (*(char *)((long)local_3c8 + uVar14 * 0x18 + 0x11) == '\x01') {
                    if (uVar21 == 0x10) {
                      uVar21 = local_260._0_4_ << 0xd;
                      if ((uVar21 & 0xf800000) == 0xf800000) {
                        fVar23 = (float)(uVar21 & 0x1fffe000 | 0x70000000);
                      }
                      else if ((uVar21 & 0xf800000) == 0) {
                        fVar23 = (float)(uVar21 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
                      }
                      else {
                        fVar23 = (float)((uVar21 & 0xfffe000) + 0x38000000);
                      }
                      fVar23 = (float)((local_260._0_4_ & 0x8000) << 0x10 | (uint)fVar23);
                    }
                    else if (uVar21 != 0x20) {
                      __assert_fail("numBits == 16 || numBits == 32",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                    ,0xd2,
                                    "uint32_t imageio::convertSFloatToUInt(uint32_t, uint32_t)");
                    }
                    puVar1[uVar17] = (uint)(long)fVar23;
                  }
                  else if (*(char *)((long)local_3c8 + uVar14 * 0x18 + 0x11) == '\0') {
                    if ((uVar21 < 0xf) && ((0x4c00U >> (uVar21 & 0x1f) & 1) != 0)) {
                      __assert_fail("false && \"Not yet implemented\"",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                    ,0xdd,
                                    "uint32_t imageio::convertUFloatToUInt(uint32_t, uint32_t)");
                    }
                    __assert_fail("numBits == 10 || numBits == 11 || numBits == 14",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                  ,0xda,"uint32_t imageio::convertUFloatToUInt(uint32_t, uint32_t)")
                    ;
                  }
                }
                else {
                  if (*(char *)((long)local_3c8 + uVar14 * 0x18 + 0x11) == '\x01') {
                    if (uVar21 - 1 < 0x20) {
                      __assert_fail("false && \"Not yet implemented\"",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                    ,0xe4,"uint32_t imageio::convertSIntToUInt(uint32_t, uint32_t)")
                      ;
                    }
                    __assert_fail("numBits > 0 && numBits <= 32",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                  ,0xe1,"uint32_t imageio::convertSIntToUInt(uint32_t, uint32_t)");
                  }
                  if ((cVar6 == '\0') && (*(char *)((long)local_3c8 + uVar14 * 0x18 + 0x11) == '\0')
                     ) {
                    if (0x1f < uVar21 - 1) {
                      __assert_fail("numBits > 0 && numBits <= 32",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                    ,0xe8,"uint32_t imageio::convertUIntToUInt(uint32_t, uint32_t)")
                      ;
                    }
                    goto LAB_001920b4;
                  }
                }
              }
              uVar21 = (int)uVar14 + 1;
              uVar14 = (ulong)uVar21;
            } while (uVar21 != local_3e8);
          }
          uVar14 = local_360 + 1;
        } while (uVar14 != local_370);
      }
      local_3d4 = local_3d4 + 1;
    } while (local_3d4 != height);
  }
  local_2a0 = (_EXRAttribute *)0x0;
  pcStack_298 = (char *)0x0;
  local_2b0 = (_EXRAttribute *)0x0;
  iStack_2a8._M_current = (_EXRAttribute *)0x0;
  local_290 = (uchar *)0x0;
  InitEXRHeader((EXRHeader *)local_358);
  InitEXRImage((EXRImage *)(local_358 + 0x88));
  ppuVar15 = (uchar **)&local_288;
  local_358._156_4_ = height;
  local_358._160_4_ = local_3e8;
  local_358._120_4_ = local_3e8;
  local_358._144_8_ = ppuVar15;
  local_358._152_4_ = width;
  __dest = (EXRChannelInfo *)malloc((long)(int)local_3e8 * 0x110);
  pvVar11 = local_3c8;
  local_358._124_4_ = 0;
  local_358._104_8_ = __dest;
  if (local_3e8 != 0) {
    lVar19 = local_3a8 * 0x18;
    lVar22 = 0;
    do {
      strncpy(__dest->name,*(char **)((long)pvVar11 + lVar22 + 8),0xff);
      *ppuVar15 = *(uchar **)
                   ((long)&((local_3a0.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar22);
      __dest = __dest + 1;
      lVar22 = lVar22 + 0x18;
      ppuVar15 = ppuVar15 + 1;
    } while (lVar19 != lVar22);
  }
  sVar16 = (long)(int)local_3e8 << 2;
  piVar9 = (int *)malloc(sVar16);
  local_358._112_8_ = piVar9;
  local_358._128_8_ = malloc(sVar16);
  if (0 < (long)(int)local_358._120_4_) {
    piVar2 = (pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar19 = 0;
    do {
      piVar9[lVar19] = (uint)(piVar2[lVar19] != 0) * 2;
      *(int *)(local_358._128_8_ + lVar19 * 4) = piVar2[lVar19];
      lVar19 = lVar19 + 1;
    } while ((int)local_358._120_4_ != lVar19);
  }
  cVar6 = getPrimaries((local_378->basic).field_0x1);
  pCVar3 = local_380;
  if (cVar6 != '\0') {
    memset(local_260,0,0x210);
    strncpy(local_260,"chromaticities",0x100);
    strncpy(local_160,"chromaticities",0x100);
    iVar5._M_current = iStack_2a8._M_current;
    local_58 = 0x20;
    local_60 = local_50;
    if (iStack_2a8._M_current == local_2a0) {
      std::vector<_EXRAttribute,std::allocator<_EXRAttribute>>::
      _M_realloc_insert<_EXRAttribute_const&>
                ((vector<_EXRAttribute,std::allocator<_EXRAttribute>> *)&local_2b0,iStack_2a8,
                 (_EXRAttribute *)local_260);
    }
    else {
      memcpy(iStack_2a8._M_current,local_260,0x210);
      iStack_2a8._M_current = iVar5._M_current + 1;
    }
  }
  iVar5._M_current = iStack_2a8._M_current;
  p_Var4 = local_2b0;
  lVar19 = ((long)iStack_2a8._M_current - (long)local_2b0 >> 4) * 0xf83e0f83e0f83e1;
  local_358._92_4_ = (undefined4)lVar19;
  pEVar10 = (EXRAttribute *)malloc((long)iStack_2a8._M_current - (long)local_2b0);
  local_358._96_8_ = pEVar10;
  if (iVar5._M_current != p_Var4) {
    lVar19 = lVar19 + (ulong)(lVar19 == 0);
    lVar22 = 0;
    do {
      memcpy(pEVar10->name + lVar22,p_Var4->name + lVar22,0x210);
      lVar22 = lVar22 + 0x210;
      lVar19 = lVar19 + -1;
    } while (lVar19 != 0);
  }
  pvVar11 = (void *)SaveEXRImageToMemory
                              ((EXRImage *)(local_358 + 0x88),(EXRHeader *)local_358,&local_290,
                               &pcStack_298);
  if (pvVar11 == (void *)0x0) {
    Reporter::fatal<char_const(&)[23],char_const*&>
              (&(pCVar3->super_Command).super_Reporter,IO_FAILURE,
               (char (*) [23])"EXR Encoder error: {}.",&pcStack_298);
  }
  report = &(pCVar3->super_Command).super_Reporter;
  OutputStream::OutputStream((OutputStream *)local_260,local_388,report);
  OutputStream::write((OutputStream *)local_260,(int)local_290,pvVar11,(size_t)report);
  OutputStream::~OutputStream((OutputStream *)local_260);
  saveEXR::EXRStruct::~EXRStruct((EXRStruct *)local_358);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_3a0);
  if (local_3c8 != (void *)0x0) {
    operator_delete(local_3c8,local_3b8 - (long)local_3c8);
  }
  return;
}

Assistant:

void CommandExtract::saveEXR(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        const std::vector<int>& pixelTypes, const char* data, std::size_t size) {
    assert(!format.samples.empty());

    if (appendExtension && filepath != "-")
        filepath += ".exr";

    struct Channel {
        uint32_t offset;
        uint32_t bits;
        const char* name;
        bool isFloat;
        bool isSigned;
        bool isNormalized;
    };
    std::vector<Channel> channels;

    if (format.model() == KHR_DF_MODEL_RGBSDA) {
        const auto addChannel = [&](auto channelType, const char* channelName) {
            if (const auto sample = format.find(channelType))
                channels.push_back({
                        sample->bitOffset,
                        sample->bitLength + 1u,
                        channelName,
                        sample->qualifierFloat != 0,
                        sample->qualifierSigned != 0,
                        sample->upper != (sample->qualifierFloat != 0 ? bit_cast<uint32_t>(1.0f) : 1u)
                });
        };

        // Must be ABGR order, since most of EXR viewers expect this channel order by convention.
        addChannel(KHR_DF_CHANNEL_RGBSDA_A, "A");
        addChannel(KHR_DF_CHANNEL_RGBSDA_D, "D");
        addChannel(KHR_DF_CHANNEL_RGBSDA_S, "S");
        addChannel(KHR_DF_CHANNEL_RGBSDA_B, "B");
        addChannel(KHR_DF_CHANNEL_RGBSDA_G, "G");
        addChannel(KHR_DF_CHANNEL_RGBSDA_R, "R");
    // } else if (formatDescriptor.model() == KHR_DF_MODEL_YUVSDA) {
    // Other color model support would come here
    } else {
        fatal(rc::NOT_SUPPORTED, "EXR saving is unsupported for {} with {}.", toString(format.model()), toString(vkFormat));
    }

    const auto pixelBytes = format.pixelByteCount();
    const auto numChannels = vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32 ? 3 : format.channelCount();
    assert(size == width * height * pixelBytes); (void) size;
    assert(numChannels == pixelTypes.size());

    // Image data is prepared with either floats or uint32
    // (half output is will be converted from float by TinyEXR during save)
    std::vector<std::vector<uint32_t>> images(numChannels);
    std::array<uint32_t*, 4> imagePtrs{};
    for (uint32_t i = 0; i < numChannels; ++i)
        images[i].resize(width * height);

    for (uint32_t y = 0; y < height; y++) {
        for (uint32_t x = 0; x < width; x++) {
            const char* rawPixel = data + (y * width + x) * pixelBytes;

            if (vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
                // Special case for VK_FORMAT_E5B9G9R9_UFLOAT_PACK32
                assert(numChannels == 3);
                assert(pixelTypes[0] == TINYEXR_PIXELTYPE_HALF);
                uint32_t pixel;
                std::memcpy(&pixel, rawPixel, sizeof(uint32_t));
                const auto values = glm::unpackF3x9_E1x5(pixel);
                images[2][y * width + x] = bit_cast<uint32_t>(values.r);
                images[1][y * width + x] = bit_cast<uint32_t>(values.g);
                images[0][y * width + x] = bit_cast<uint32_t>(values.b);
            } else {
                for (uint32_t c = 0; c < numChannels; c++) {
                    const auto& channel = channels[c];
                    const auto offset = channel.offset;
                    const auto bits = channel.bits;

                    const auto value = extract_bits<uint32_t>(rawPixel, offset, bits);
                    auto& target = images[c][y * width + x];

                    if (pixelTypes[c] == TINYEXR_PIXELTYPE_FLOAT || pixelTypes[c] == TINYEXR_PIXELTYPE_HALF) {
                        if (channel.isFloat) {
                            if (channel.isSigned)
                                target = bit_cast<uint32_t>(convertSFloatToFloat(value, bits));
                            else
                                target = bit_cast<uint32_t>(convertUFloatToFloat(value, bits));
                        } else {
                            if (channel.isNormalized) {
                                if (channel.isSigned)
                                    target = bit_cast<uint32_t>(convertSNORMToFloat(value, bits));
                                else
                                    target = bit_cast<uint32_t>(convertUNORMToFloat(value, bits));
                            } else {
                                if (channel.isSigned)
                                    target = bit_cast<uint32_t>(convertSIntToFloat(value, bits));
                                else
                                    target = bit_cast<uint32_t>(convertUIntToFloat(value, bits));
                            }
                        }
                    } else if (pixelTypes[c] == TINYEXR_PIXELTYPE_UINT) {
                        if (channel.isFloat && channel.isSigned) {
                            target = convertSFloatToUInt(value, bits);
                        } else if (channel.isFloat && !channel.isSigned) {
                            target = convertUFloatToUInt(value, bits);
                        } else if (!channel.isFloat && channel.isSigned) {
                            target = convertSIntToUInt(value, bits);
                        } else if (!channel.isFloat && !channel.isSigned) {
                            target = convertUIntToUInt(value, bits);
                        }
                    } else
                        assert(false && "Internal error");
                }
            }
        }
    }

    struct EXRStruct {
        EXRHeader header;
        EXRImage image;
        std::vector<EXRAttribute> attributes;
        const char* err = nullptr;
        unsigned char* fileData = nullptr;
        EXRStruct() {
            InitEXRHeader(&header);
            InitEXRImage(&image);
        }
        ~EXRStruct() {
            if (header.custom_attributes != nullptr) {
                free(header.custom_attributes);
                header.custom_attributes = nullptr;
                header.num_custom_attributes = 0;
            }
            image.images = nullptr; // null out the images to stop TinyEXR from trying to free them
            FreeEXRImage(&image);
            FreeEXRHeader(&header);
            FreeEXRErrorMessage(err);
            free(fileData);
        }
        void addAttributesToHeader() {
            header.num_custom_attributes = static_cast<int>(attributes.size());
            header.custom_attributes = (EXRAttribute*)malloc(sizeof(EXRAttribute) * attributes.size());
            for (size_t i = 0; i < attributes.size(); ++i) {
                header.custom_attributes[i] = attributes[i];
            }
        }
    } exr;

    exr.image.images = reinterpret_cast<unsigned char**>(imagePtrs.data());
    exr.image.width = static_cast<int>(width);
    exr.image.height = static_cast<int>(height);
    exr.image.num_channels = static_cast<int>(numChannels);

    exr.header.num_channels = static_cast<int>(numChannels);
    exr.header.channels = (EXRChannelInfo*) malloc(sizeof(EXRChannelInfo) * exr.header.num_channels);
    // TODO: Question: Should we use a compression for exr outputs?
    exr.header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;

    for (uint32_t c = 0; c < numChannels; c++) {
        const auto& channel = channels[c];
        strncpy(exr.header.channels[c].name, channel.name, 255);
        imagePtrs[c] = images[c].data();
    }

    exr.header.pixel_types = (int *)malloc(sizeof(int) * exr.header.num_channels);
    exr.header.requested_pixel_types = (int *)malloc(sizeof(int) * exr.header.num_channels);
    for (int i = 0; i < exr.header.num_channels; i++) {
        // pixel type of the input image
        exr.header.pixel_types[i] = (pixelTypes[i] == TINYEXR_PIXELTYPE_UINT) ? TINYEXR_PIXELTYPE_UINT : TINYEXR_PIXELTYPE_FLOAT;
        // pixel type of the output image to be stored in .EXR file
        exr.header.requested_pixel_types[i] = pixelTypes[i];
    }

    // Output primaries as chromaticities
    Primaries primaries;
    bool foundPrimaries = getPrimaries(format.primaries(), &primaries);
    if (foundPrimaries) {
        EXRAttribute chromaticities{};
        strncpy(chromaticities.name, "chromaticities", sizeof(chromaticities.name));
        strncpy(chromaticities.type, "chromaticities", sizeof(chromaticities.type));
        chromaticities.size = sizeof(primaries);
        chromaticities.value = reinterpret_cast<unsigned char*>(&primaries);

        exr.attributes.push_back(chromaticities);
    }

    exr.addAttributesToHeader();
    std::size_t fileDataSize = SaveEXRImageToMemory(&exr.image, &exr.header, &exr.fileData, &exr.err);
    if (fileDataSize == 0)
        fatal(rc::IO_FAILURE, "EXR Encoder error: {}.", exr.err);

    OutputStream file(filepath, *this);
    file.write(reinterpret_cast<const char*>(exr.fileData), fileDataSize, *this);
}